

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char * nlohmann::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/./nlohmann/json.hpp"
                  ,0x353b,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (max_exp < 1) {
    __assert_fail("max_exp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/./nlohmann/json.hpp"
                  ,0x353c,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  uVar8 = decimal_exponent + len;
  if ((int)uVar8 <= max_exp && -1 < decimal_exponent) {
    memset(buf + len,0x30,(ulong)(uint)decimal_exponent);
    pcVar1 = buf + (int)uVar8;
    pcVar1[0] = '.';
    pcVar1[1] = '0';
    return pcVar1 + 2;
  }
  if (0 < (int)uVar8 && (int)uVar8 <= max_exp) {
    if (decimal_exponent < 0) {
      memmove(buf + uVar8 + 1,buf + uVar8,(long)-decimal_exponent);
      buf[uVar8] = '.';
      return buf + (long)len + 1;
    }
    __assert_fail("k > n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/./nlohmann/json.hpp"
                  ,0x3556,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (min_exp < (int)uVar8 && (int)uVar8 < 1) {
    memmove(buf + (2 - uVar8),buf,(long)len);
    buf[0] = '0';
    buf[1] = '.';
    memset(buf + 2,0x30,(ulong)-uVar8);
    return buf + (int)((2 - uVar8) + len);
  }
  if (len != 1) {
    memmove(buf + 2,buf + 1,(long)(len + -1));
    buf[1] = '.';
    buf = buf + len;
  }
  buf[1] = 'e';
  if ((int)uVar8 < -0x3e6) {
    __assert_fail("e > -1000",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/./nlohmann/json.hpp"
                  ,0x3506,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  if (1000 < (int)uVar8) {
    __assert_fail("e < 1000",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/./nlohmann/json.hpp"
                  ,0x3507,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  uVar5 = uVar8 - 1;
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  buf[2] = ((int)uVar8 < 1) * '\x02' + '+';
  if (uVar3 < 10) {
    buf[3] = '0';
  }
  else {
    if (99 < uVar3) {
      uVar8 = (uVar3 & 0xffff) / 100;
      buf[3] = (char)uVar8 + '0';
      iVar4 = uVar3 + uVar8 * -100;
      bVar2 = (byte)((iVar4 * 0x67 & 0xffffU) >> 10);
      buf[4] = bVar2 | 0x30;
      pbVar7 = (byte *)(buf + 5);
      bVar2 = (char)iVar4 + bVar2 * -10;
      lVar6 = 4;
      goto LAB_0011653f;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    buf[3] = bVar2 | 0x30;
    uVar3 = (uint)(byte)((char)uVar3 + bVar2 * -10);
  }
  bVar2 = (byte)uVar3;
  pbVar7 = (byte *)(buf + 4);
  lVar6 = 3;
LAB_0011653f:
  *pbVar7 = bVar2 | 0x30;
  return buf + lVar6 + 2;
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    assert(min_exp < 0);
    assert(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n and n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n - k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (n + 2);
    }

    if (0 < n and n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        assert(k > n);

        std::memmove(buf + (n + 1), buf + n, static_cast<size_t>(k - n));
        buf[n] = '.';
        return buf + (k + 1);
    }

    if (min_exp < n and n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + -n), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2 + (-n) + k);
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k - 1));
        buf[1] = '.';
        buf += 1 + k;
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}